

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void fmt::v7::detail::fallback_format<long_double>
               (longdouble d,int num_digits,bool binary32,buffer<char> *buf,int *exp10)

{
  uint *puVar1;
  uint *puVar2;
  uint *puVar3;
  uint *puVar4;
  float fVar5;
  char *pcVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  bigint *lhs2;
  bool bVar12;
  ulong uVar13;
  uint uVar14;
  uint64_t n;
  undefined7 in_register_00000031;
  long lVar15;
  ulong uVar16;
  bigint denominator;
  bigint numerator;
  bigint lower;
  bigint upper_store;
  bigint *local_340;
  bigint local_2f0;
  bigint local_240;
  bigint local_190;
  bigint local_e0;
  
  uVar11 = (ulong)(uint)num_digits;
  n = 0;
  local_240.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_240.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_0014e500;
  puVar1 = local_240.bigits_.store_;
  local_240.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_240.exp_ = 0;
  local_2f0.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_2f0.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_0014e500;
  puVar2 = local_2f0.bigits_.store_;
  local_2f0.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_2f0.exp_ = 0;
  local_190.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_190.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_0014e500;
  puVar3 = local_190.bigits_.store_;
  local_190.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_190.exp_ = 0;
  local_340 = &local_e0;
  local_e0.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_e0.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_0014e500;
  puVar4 = local_e0.bigits_.store_;
  local_e0.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_e0.exp_ = 0;
  local_2f0.bigits_.super_buffer<unsigned_int>.ptr_ = puVar2;
  local_240.bigits_.super_buffer<unsigned_int>.ptr_ = puVar1;
  local_190.bigits_.super_buffer<unsigned_int>.ptr_ = puVar3;
  local_e0.bigits_.super_buffer<unsigned_int>.ptr_ = puVar4;
  if ((int)CONCAT71(in_register_00000031,binary32) == 0) {
    iVar8 = 1;
    iVar9 = 0;
    uVar16 = 0;
    bVar12 = false;
LAB_0011da76:
    uVar14 = (uint)uVar16;
    bigint::assign(&local_240,n);
    bigint::operator<<=(&local_240,iVar9);
    bigint::assign(&local_190,1);
    bigint::operator<<=(&local_190,iVar9);
    if (bVar12) {
      local_340 = &local_e0;
      bigint::assign(local_340,1);
      bigint::operator<<=(&local_e0,iVar9 + 1);
    }
    else {
      local_340 = (bigint *)0x0;
    }
    bigint::assign_pow10(&local_2f0,*exp10);
    bigint::operator<<=(&local_2f0,iVar8);
  }
  else {
    fVar5 = (float)d;
    uVar13 = (ulong)((uint)fVar5 & 0x7fffff);
    if ((uint)fVar5 < 0x800000) {
      n = (uint64_t)(((uint)fVar5 & 0x7fffff) * 2);
      iVar9 = -0x95;
      iVar8 = 1;
      bVar12 = false;
      uVar16 = uVar13;
    }
    else {
      uVar16 = uVar13 + 0x800000;
      iVar9 = ((uint)fVar5 >> 0x17) - 0x96;
      bVar12 = 0xffffff < (uint)fVar5 && uVar13 == 0;
      iVar8 = bVar12 + 1;
      n = uVar16 << (sbyte)iVar8;
      if (0x4affffff < (uint)fVar5) goto LAB_0011da76;
    }
    uVar14 = (uint)uVar16;
    if (*exp10 < 0) {
      bigint::assign_pow10(&local_240,-*exp10);
      bigint::assign(&local_190,&local_240);
      if (bVar12) {
        local_340 = &local_e0;
        bigint::assign(local_340,&local_240);
        bigint::operator<<=(&local_e0,1);
      }
      else {
        local_340 = (bigint *)0x0;
      }
      bigint::multiply(&local_240,n);
      bigint::assign(&local_2f0,1);
      bigint::operator<<=(&local_2f0,iVar8 - iVar9);
    }
    else {
      bigint::assign(&local_240,n);
      bigint::assign_pow10(&local_2f0,*exp10);
      bigint::operator<<=(&local_2f0,iVar8 - iVar9);
      bigint::assign(&local_190,1);
      if (bVar12) {
        bigint::assign(&local_e0,2);
      }
      else {
        local_340 = (bigint *)0x0;
      }
    }
  }
  if (-1 < num_digits) {
    *exp10 = *exp10 - (num_digits + -1);
    uVar14 = num_digits - 1;
    if (num_digits == 0) {
      uVar11 = 1;
      if (buf->capacity_ == 0) {
        (**buf->_vptr_buffer)(buf,1);
        uVar11 = (ulong)(buf->capacity_ != 0);
      }
      buf->size_ = uVar11;
      bigint::multiply(&local_2f0,10);
      iVar8 = add_compare(&local_240,&local_240,&local_2f0);
      *buf->ptr_ = 0 < iVar8 | 0x30;
    }
    else {
      uVar13 = (ulong)(uint)num_digits;
      uVar16 = buf->capacity_;
      if (uVar16 < uVar13) {
        (**buf->_vptr_buffer)(buf,uVar13);
        uVar16 = buf->capacity_;
      }
      if (uVar16 < uVar13) {
        uVar13 = uVar16;
      }
      buf->size_ = uVar13;
      if (num_digits != 1) {
        uVar16 = 0;
        do {
          iVar8 = bigint::divmod_assign(&local_240,&local_2f0);
          buf->ptr_[uVar16] = (char)iVar8 + '0';
          bigint::multiply(&local_240,10);
          uVar16 = uVar16 + 1;
        } while (uVar14 != uVar16);
      }
      uVar10 = bigint::divmod_assign(&local_240,&local_2f0);
      iVar8 = add_compare(&local_240,&local_240,&local_2f0);
      if ((0 < iVar8) || ((uVar10 & 1) != 0 && iVar8 == 0)) {
        if (uVar10 == 9) {
          buf->ptr_[(int)uVar14] = ':';
          if (num_digits != 1) {
            uVar16 = (ulong)(num_digits - 2);
            do {
              uVar14 = (int)uVar11 - 1;
              uVar11 = (ulong)uVar14;
              if (buf->ptr_[uVar11] != ':') break;
              buf->ptr_[uVar11] = '0';
              buf->ptr_[uVar16] = buf->ptr_[uVar16] + '\x01';
              uVar16 = uVar16 - 1;
            } while (1 < (int)uVar14);
          }
          if (*buf->ptr_ == ':') {
            *buf->ptr_ = '1';
            *exp10 = *exp10 + 1;
          }
          goto LAB_0011df25;
        }
        uVar10 = uVar10 + 1;
      }
      buf->ptr_[(int)uVar14] = (char)uVar10 + '0';
    }
    goto LAB_0011df25;
  }
  lhs2 = local_340;
  if (local_340 == (bigint *)0x0) {
    lhs2 = &local_190;
  }
  pcVar6 = buf->ptr_;
  uVar14 = ~uVar14 & 1;
  lVar15 = 0;
  while( true ) {
    uVar10 = bigint::divmod_assign(&local_240,&local_2f0);
    iVar8 = compare(&local_240,&local_190);
    iVar9 = add_compare(&local_240,lhs2,&local_2f0);
    pcVar6[lVar15] = (char)uVar10 + '0';
    if ((iVar8 < (int)uVar14) || ((int)-uVar14 < iVar9)) break;
    bigint::multiply(&local_240,10);
    bigint::multiply(&local_190,10);
    if (local_340 != (bigint *)0x0) {
      bigint::multiply(local_340,10);
    }
    lVar15 = lVar15 + 1;
  }
  if (iVar8 < (int)uVar14) {
    if ((int)-uVar14 < iVar9) {
      iVar8 = add_compare(&local_240,&local_240,&local_2f0);
      if ((0 < iVar8) || ((uVar10 & 1) != 0 && iVar8 == 0)) {
        cVar7 = pcVar6[lVar15] + '\x01';
        goto LAB_0011de75;
      }
    }
  }
  else {
    cVar7 = (char)uVar10 + '1';
LAB_0011de75:
    pcVar6[lVar15] = cVar7;
  }
  uVar16 = lVar15 + 1U & 0xffffffff;
  uVar11 = buf->capacity_;
  if (uVar11 < uVar16) {
    (**buf->_vptr_buffer)(buf,uVar16);
    uVar11 = buf->capacity_;
  }
  if (uVar11 < uVar16) {
    uVar16 = uVar11;
  }
  buf->size_ = uVar16;
  *exp10 = *exp10 - (int)lVar15;
LAB_0011df25:
  if (local_e0.bigits_.super_buffer<unsigned_int>.ptr_ != puVar4) {
    operator_delete(local_e0.bigits_.super_buffer<unsigned_int>.ptr_,
                    local_e0.bigits_.super_buffer<unsigned_int>.capacity_ << 2);
  }
  if (local_190.bigits_.super_buffer<unsigned_int>.ptr_ != puVar3) {
    operator_delete(local_190.bigits_.super_buffer<unsigned_int>.ptr_,
                    local_190.bigits_.super_buffer<unsigned_int>.capacity_ << 2);
  }
  if (local_2f0.bigits_.super_buffer<unsigned_int>.ptr_ != puVar2) {
    operator_delete(local_2f0.bigits_.super_buffer<unsigned_int>.ptr_,
                    local_2f0.bigits_.super_buffer<unsigned_int>.capacity_ << 2);
  }
  if (local_240.bigits_.super_buffer<unsigned_int>.ptr_ != puVar1) {
    operator_delete(local_240.bigits_.super_buffer<unsigned_int>.ptr_,
                    local_240.bigits_.super_buffer<unsigned_int>.capacity_ << 2);
  }
  return;
}

Assistant:

void fallback_format(Double d, int num_digits, bool binary32, buffer<char>& buf,
                     int& exp10) {
  bigint numerator;    // 2 * R in (FPP)^2.
  bigint denominator;  // 2 * S in (FPP)^2.
  // lower and upper are differences between value and corresponding boundaries.
  bigint lower;             // (M^- in (FPP)^2).
  bigint upper_store;       // upper's value if different from lower.
  bigint* upper = nullptr;  // (M^+ in (FPP)^2).
  fp value;
  // Shift numerator and denominator by an extra bit or two (if lower boundary
  // is closer) to make lower and upper integers. This eliminates multiplication
  // by 2 during later computations.
  const bool is_predecessor_closer =
      binary32 ? value.assign(static_cast<float>(d)) : value.assign(d);
  int shift = is_predecessor_closer ? 2 : 1;
  uint64_t significand = value.f << shift;
  if (value.e >= 0) {
    numerator.assign(significand);
    numerator <<= value.e;
    lower.assign(1);
    lower <<= value.e;
    if (shift != 1) {
      upper_store.assign(1);
      upper_store <<= value.e + 1;
      upper = &upper_store;
    }
    denominator.assign_pow10(exp10);
    denominator <<= shift;
  } else if (exp10 < 0) {
    numerator.assign_pow10(-exp10);
    lower.assign(numerator);
    if (shift != 1) {
      upper_store.assign(numerator);
      upper_store <<= 1;
      upper = &upper_store;
    }
    numerator *= significand;
    denominator.assign(1);
    denominator <<= shift - value.e;
  } else {
    numerator.assign(significand);
    denominator.assign_pow10(exp10);
    denominator <<= shift - value.e;
    lower.assign(1);
    if (shift != 1) {
      upper_store.assign(1ULL << 1);
      upper = &upper_store;
    }
  }
  // Invariant: value == (numerator / denominator) * pow(10, exp10).
  if (num_digits < 0) {
    // Generate the shortest representation.
    if (!upper) upper = &lower;
    bool even = (value.f & 1) == 0;
    num_digits = 0;
    char* data = buf.data();
    for (;;) {
      int digit = numerator.divmod_assign(denominator);
      bool low = compare(numerator, lower) - even < 0;  // numerator <[=] lower.
      // numerator + upper >[=] pow10:
      bool high = add_compare(numerator, *upper, denominator) + even > 0;
      data[num_digits++] = static_cast<char>('0' + digit);
      if (low || high) {
        if (!low) {
          ++data[num_digits - 1];
        } else if (high) {
          int result = add_compare(numerator, numerator, denominator);
          // Round half to even.
          if (result > 0 || (result == 0 && (digit % 2) != 0))
            ++data[num_digits - 1];
        }
        buf.try_resize(to_unsigned(num_digits));
        exp10 -= num_digits - 1;
        return;
      }
      numerator *= 10;
      lower *= 10;
      if (upper != &lower) *upper *= 10;
    }
  }
  // Generate the given number of digits.
  exp10 -= num_digits - 1;
  if (num_digits == 0) {
    buf.try_resize(1);
    denominator *= 10;
    buf[0] = add_compare(numerator, numerator, denominator) > 0 ? '1' : '0';
    return;
  }
  buf.try_resize(to_unsigned(num_digits));
  for (int i = 0; i < num_digits - 1; ++i) {
    int digit = numerator.divmod_assign(denominator);
    buf[i] = static_cast<char>('0' + digit);
    numerator *= 10;
  }
  int digit = numerator.divmod_assign(denominator);
  auto result = add_compare(numerator, numerator, denominator);
  if (result > 0 || (result == 0 && (digit % 2) != 0)) {
    if (digit == 9) {
      const auto overflow = '0' + 10;
      buf[num_digits - 1] = overflow;
      // Propagate the carry.
      for (int i = num_digits - 1; i > 0 && buf[i] == overflow; --i) {
        buf[i] = '0';
        ++buf[i - 1];
      }
      if (buf[0] == overflow) {
        buf[0] = '1';
        ++exp10;
      }
      return;
    }
    ++digit;
  }
  buf[num_digits - 1] = static_cast<char>('0' + digit);
}